

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

int Curl_cookie_getlist(Curl_easy *data,CookieInfo *ci,char *host,char *path,_Bool secure,
                       Curl_llist *list)

{
  char cVar1;
  char *pcVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  Curl_llist_node *pCVar10;
  void *pvVar11;
  size_t sVar12;
  char *__s;
  char *pcVar13;
  size_t sVar14;
  undefined8 *__base;
  long lVar15;
  undefined8 *puVar16;
  size_t __nmemb;
  
  sVar8 = cookiehash(host);
  Curl_llist_init(list,(Curl_llist_dtor)0x0);
  iVar7 = 1;
  if (ci != (CookieInfo *)0x0) {
    sVar9 = Curl_llist_count(ci->cookielist + sVar8);
    if (sVar9 != 0) {
      remove_expired(ci);
      _Var4 = Curl_host_is_ipnum(host);
      pCVar10 = Curl_llist_head(ci->cookielist + sVar8);
      if (pCVar10 != (Curl_llist_node *)0x0) {
        __nmemb = 0;
        do {
          pvVar11 = Curl_node_elem(pCVar10);
          if ((*(byte *)((long)pvVar11 + 0x74) >> 1 & !secure) == 0) {
            pcVar2 = *(char **)((long)pvVar11 + 0x60);
            if (pcVar2 != (char *)0x0) {
              bVar5 = *(byte *)((long)pvVar11 + 0x74) & 1;
              if (bVar5 != 0 && !_Var4) {
                sVar12 = strlen(pcVar2);
                _Var6 = cookie_tailmatch(pcVar2,sVar12,host);
                if (_Var6) goto LAB_0011eb98;
                bVar5 = *(byte *)((long)pvVar11 + 0x74) & 1;
              }
              if ((bVar5 != 0 && !_Var4) ||
                 (iVar7 = curl_strequal(host,*(char **)((long)pvVar11 + 0x60)), iVar7 == 0))
              goto LAB_0011ec67;
            }
LAB_0011eb98:
            pcVar2 = *(char **)((long)pvVar11 + 0x58);
            if ((pcVar2 == (char *)0x0) || (sVar12 = strlen(pcVar2), sVar12 == 1))
            goto LAB_0011ebaf;
            __s = (*Curl_cstrdup)(path);
            if (__s != (char *)0x0) {
              pcVar13 = strchr(__s,0x3f);
              if (pcVar13 != (char *)0x0) {
                *pcVar13 = '\0';
              }
              if (*__s != '/') {
                (*Curl_cfree)(__s);
                __s = (char *)Curl_memdup0("/",1);
                if (__s == (char *)0x0) goto LAB_0011ec67;
              }
              sVar14 = strlen(__s);
              if ((sVar14 < sVar12) || (iVar7 = strncmp(pcVar2,__s,sVar12), iVar7 != 0)) {
                (*Curl_cfree)(__s);
              }
              else {
                if (sVar12 == sVar14) {
                  (*Curl_cfree)(__s);
                }
                else {
                  cVar1 = __s[sVar12];
                  (*Curl_cfree)(__s);
                  if (cVar1 != '/') goto LAB_0011ec67;
                }
LAB_0011ebaf:
                Curl_llist_append(list,pvVar11,(Curl_llist_node *)((long)pvVar11 + 0x20));
                __nmemb = __nmemb + 1;
                if (0x95 < __nmemb) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                     ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar3->log_level)))) {
                    Curl_infof(data,"Included max number of cookies (%zu) in request!",__nmemb);
                  }
                  goto LAB_0011ecc2;
                }
              }
            }
          }
LAB_0011ec67:
          pCVar10 = Curl_node_next(pCVar10);
        } while (pCVar10 != (Curl_llist_node *)0x0);
        if (__nmemb != 0) {
LAB_0011ecc2:
          __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
          if (__base == (undefined8 *)0x0) {
            Curl_llist_destroy(list,(void *)0x0);
            return 2;
          }
          pCVar10 = Curl_llist_head(list);
          puVar16 = __base;
          while (pCVar10 != (Curl_llist_node *)0x0) {
            pvVar11 = Curl_node_elem(pCVar10);
            *puVar16 = pvVar11;
            pCVar10 = Curl_node_next(pCVar10);
            puVar16 = puVar16 + 1;
          }
          qsort(__base,__nmemb,8,cookie_sort);
          lVar15 = 0;
          Curl_llist_destroy(list,(void *)0x0);
          do {
            Curl_llist_append(list,(void *)__base[lVar15],
                              (Curl_llist_node *)((long)__base[lVar15] + 0x20));
            lVar15 = lVar15 + 1;
          } while (__nmemb + (__nmemb == 0) != lVar15);
          (*Curl_cfree)(__base);
        }
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Curl_cookie_getlist(struct Curl_easy *data,
                        struct CookieInfo *ci,
                        const char *host, const char *path,
                        bool secure,
                        struct Curl_llist *list)
{
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);
  struct Curl_llist_node *n;

  Curl_llist_init(list, NULL);

  if(!ci || !Curl_llist_count(&ci->cookielist[myhash]))
    return 1; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(ci);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  for(n = Curl_llist_head(&ci->cookielist[myhash]);
      n; n = Curl_node_next(n)) {
    struct Cookie *co = Curl_node_elem(n);

    /* if the cookie requires we are secure we must only continue if we are! */
    if(co->secure ? secure : TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * This is a match and we add it to the return-linked-list
           */
          Curl_llist_append(list, co, &co->getnode);
          matches++;
          if(matches >= MAX_COOKIE_SEND_AMOUNT) {
            infof(data, "Included max number of cookies (%zu) in request!",
                  matches);
            break;
          }
        }
      }
    }
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    n = Curl_llist_head(list);

    for(i = 0; n; n = Curl_node_next(n))
      array[i++] = Curl_node_elem(n);

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */
    Curl_llist_destroy(list, NULL);

    for(i = 0; i < matches; i++)
      Curl_llist_append(list, array[i], &array[i]->getnode);

    free(array); /* remove the temporary data again */
  }

  return 0; /* success */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_llist_destroy(list, NULL);
  return 2; /* error */
}